

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_> *
wasm::WATParser::structtype<wasm::WATParser::ParseTypeDefsCtx>
          (MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
           *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
  *fields;
  basic_string_view<char,_std::char_traits<char>_> expected;
  StructT local_150;
  allocator<char> local_119;
  string local_118;
  Err local_f8;
  uint local_d4;
  Err local_d0;
  Err *local_b0;
  Err *err;
  undefined1 local_98 [8];
  Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
  _val;
  Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
  namedFields;
  ParseTypeDefsCtx *ctx_local;
  
  expected = sv("struct",6);
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar1) {
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.
                 super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
         + 0x30);
    fields<wasm::WATParser::ParseTypeDefsCtx>
              ((Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
                *)__return_storage_ptr___00,ctx);
    Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
    ::Result((Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
              *)local_98,
             (Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
              *)__return_storage_ptr___00);
    local_b0 = Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
               ::getErr((Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
                         *)local_98);
    bVar1 = local_b0 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_d0,local_b0);
      MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>::
      MaybeResult(__return_storage_ptr__,&local_d0);
      wasm::Err::~Err(&local_d0);
    }
    local_d4 = (uint)bVar1;
    Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
    ::~Result((Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
               *)local_98);
    if (local_d4 == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        fields = Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
                 ::operator*((Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
                              *)((long)&_val.val.
                                        super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                                        .
                                        super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                + 0x30));
        TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeStruct
                  (&local_150,&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,fields);
        MaybeResult<std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Struct>>::
        MaybeResult<std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Struct>>
                  ((MaybeResult<std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Struct>>
                    *)__return_storage_ptr__,&local_150);
        std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>::~pair
                  (&local_150);
        local_d4 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"expected end of struct definition",&local_119);
        Lexer::err(&local_f8,&ctx->in,&local_118);
        MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
        ::MaybeResult(__return_storage_ptr__,&local_f8);
        wasm::Err::~Err(&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator(&local_119);
        local_d4 = 1;
      }
    }
    Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
    ::~Result((Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
               *)((long)&_val.val.
                         super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                 + 0x30));
  }
  else {
    MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>::
    MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::StructT> structtype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("struct"sv)) {
    return {};
  }
  auto namedFields = fields(ctx);
  CHECK_ERR(namedFields);
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of struct definition");
  }

  return ctx.makeStruct(*namedFields);
}